

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitImplication
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,ImplicationExpr e)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  ExprBase e_00;
  size_t sVar3;
  
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ +
             8))->impl_,-1);
  pBVar2 = this->writer_->buffer_;
  sVar3 = pBVar2->size_;
  uVar1 = sVar3 + 5;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar3 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar3," ==> ",5);
  pBVar2->size_ = uVar1;
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_ +
             0x10))->impl_,4);
  e_00.impl_ = ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_
               + 0x18))->impl_;
  if (((e_00.impl_)->kind_ == 0x30) && (*(char *)(e_00.impl_ + 1) != '\x01')) {
    return;
  }
  pBVar2 = this->writer_->buffer_;
  sVar3 = pBVar2->size_;
  uVar1 = sVar3 + 6;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar3 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar3," else ",6);
  pBVar2->size_ = uVar1;
  Visit(this,(LogicalExpr)e_00.impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitImplication(ImplicationExpr e) {
  Visit(e.condition());
  writer_ << " ==> ";
  Visit(e.then_expr(), prec::IMPLICATION + 1);
  LogicalExpr else_expr = e.else_expr();
  LogicalConstant c = ExprTypes::template Cast<LogicalConstant>(else_expr);
  if (!c || c.value() != 0) {
    writer_ << " else ";
    Visit(else_expr);
  }
}